

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O1

size_t absl::lts_20240722::container_internal::PrepareInsertAfterSoo
                 (size_t hash,size_t slot_size,CommonFields *common)

{
  ctrl_t *pcVar1;
  ctrl_t *pcVar2;
  ulong uVar3;
  ulong uVar4;
  ctrl_t cVar5;
  
  if (common->capacity_ != 3) {
    __assert_fail("common.capacity() == NextCapacity(SooCapacity())",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                  ,0x85,
                  "size_t absl::container_internal::PrepareInsertAfterSoo(size_t, size_t, CommonFields &)"
                 );
  }
  CommonFields::increment_size(common);
  pcVar2 = (common->heap_or_soo_).heap.control;
  pcVar1 = pcVar2 + -8;
  if (((ulong)pcVar1 & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(gl_ptr) % alignof(GrowthInfo) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x56f,"GrowthInfo &absl::container_internal::CommonFields::growth_info()");
  }
  if ((*(undefined8 *)pcVar1 & 0x7fffffffffffffff) == ~kSentinel) {
    __assert_fail("GetGrowthLeft() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x454,"void absl::container_internal::GrowthInfo::OverwriteEmptyAsFull()");
  }
  *(undefined8 *)pcVar1 = *(undefined8 *)pcVar1 - ~kDeleted;
  uVar3 = common->capacity_;
  if (uVar3 < 0x11) {
    uVar4 = (ulong)(((uint)((ulong)pcVar2 >> 0xc) & 0xfffff ^ (uint)(hash >> 7) & 0x1ffffff) & 2);
    if (uVar4 < uVar3) {
      cVar5 = (ctrl_t)hash & ~kEmpty;
      pcVar1 = (common->heap_or_soo_).heap.control;
      pcVar1[uVar4] = cVar5;
      pcVar1[uVar3 + 1 + uVar4] = cVar5;
      if ((common->size_ & 1) != 0) {
        CommonFields::backing_array_start(common);
      }
      return uVar4;
    }
    __assert_fail("i < c.capacity()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x70c,
                  "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                 );
  }
  __assert_fail("is_single_group(c.capacity())",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x72a,
                "void absl::container_internal::SetCtrlInSingleGroupTable(const CommonFields &, size_t, ctrl_t, size_t)"
               );
}

Assistant:

size_t PrepareInsertAfterSoo(size_t hash, size_t slot_size,
                             CommonFields& common) {
  assert(common.capacity() == NextCapacity(SooCapacity()));
  // After resize from capacity 1 to 3, we always have exactly the slot with
  // index 1 occupied, so we need to insert either at index 0 or index 2.
  assert(HashSetResizeHelper::SooSlotIndex() == 1);
  PrepareInsertCommon(common);
  const size_t offset = H1(hash, common.control()) & 2;
  common.growth_info().OverwriteEmptyAsFull();
  SetCtrlInSingleGroupTable(common, offset, H2(hash), slot_size);
  common.infoz().RecordInsert(hash, /*distance_from_desired=*/0);
  return offset;
}